

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_timestep_embedding(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  ulong uVar6;
  size_t sVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 extraout_var [60];
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a88,"fatal error");
  }
  if (pgVar5->nb[0] == 4) {
    iVar1 = params->nth;
    iVar2 = params->ith;
    uVar6 = pgVar5->ne[0];
    sVar7 = dst->nb[1];
    iVar3 = dst->op_params[0];
    iVar9 = iVar3 / 2;
    lVar11 = 0;
    lVar10 = (long)iVar9 * 4;
    iVar4 = dst->op_params[1];
    for (uVar12 = 0; uVar12 != (~((long)uVar6 >> 0x3f) & uVar6); uVar12 = uVar12 + 1) {
      pvVar8 = dst->data;
      for (lVar13 = (long)iVar2; lVar13 < iVar9; lVar13 = lVar13 + iVar1) {
        fVar16 = *(float *)((long)pgVar5->data + uVar12 * 4);
        auVar17._0_4_ = logf((float)iVar4);
        auVar17._4_60_ = extraout_var;
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar14 = vxorps_avx512vl(auVar17._0_16_,auVar14);
        fVar15 = expf(((float)lVar13 * auVar14._0_4_) / (float)iVar9);
        fVar15 = fVar15 * fVar16;
        fVar16 = cosf(fVar15);
        *(float *)((long)pvVar8 + lVar13 * 4 + lVar11) = fVar16;
        fVar16 = sinf(fVar15);
        *(float *)((long)pvVar8 + lVar13 * 4 + lVar10) = fVar16;
      }
      if ((iVar2 == 0 & (byte)iVar3) != 0) {
        *(undefined4 *)((long)pvVar8 + (long)iVar3 * 4 + uVar12 * sVar7) = 0;
      }
      lVar10 = lVar10 + sVar7;
      lVar11 = lVar11 + sVar7;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1a60,"GGML_ASSERT(%s) failed","src0->nb[0] == sizeof(float)");
}

Assistant:

void ggml_compute_forward_timestep_embedding(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_timestep_embedding_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}